

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Clara::CommonArgProperties<Catch::ConfigData>::validate
          (CommonArgProperties<Catch::ConfigData> *this)

{
  logic_error *this_00;
  allocator local_39;
  string local_38 [32];
  
  if ((this->boundField).functionObj != (IArgFunction<Catch::ConfigData> *)0x0) {
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string(local_38,"option not bound",&local_39);
  std::logic_error::logic_error(this_00,local_38);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

bool isSet() const {
                return functionObj != CLARA_NULL;
            }